

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int memdbFileControl(sqlite3_file *pFile,int op,void *pArg)

{
  sqlite3_io_methods *psVar1;
  char *pcVar2;
  _func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *p_Var3;
  int iVar4;
  bool bVar5;
  
  psVar1 = pFile[1].pMethods;
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)psVar1->xTruncate);
  }
  iVar4 = 0xc;
  if (op == 0xc) {
    iVar4 = 0;
    pcVar2 = sqlite3_mprintf("memdb(%p,%lld)",psVar1->xWrite,*(long *)psVar1);
    *(char **)pArg = pcVar2;
  }
  if (op == 0x24) {
    p_Var3 = *pArg;
    if (((long)p_Var3 < (long)*(_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **)psVar1) &&
       (bVar5 = (long)p_Var3 < 0,
       p_Var3 = *(_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **)psVar1, bVar5)) {
      p_Var3 = psVar1->xRead;
    }
    psVar1->xRead = p_Var3;
    *(_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 **)pArg = p_Var3;
    iVar4 = 0;
  }
  if ((sqlite3_mutex *)psVar1->xTruncate != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)((sqlite3_mutex *)psVar1->xTruncate);
  }
  return iVar4;
}

Assistant:

static int memdbFileControl(sqlite3_file *pFile, int op, void *pArg){
  MemStore *p = ((MemFile*)pFile)->pStore;
  int rc = SQLITE_NOTFOUND;
  memdbEnter(p);
  if( op==SQLITE_FCNTL_VFSNAME ){
    *(char**)pArg = sqlite3_mprintf("memdb(%p,%lld)", p->aData, p->sz);
    rc = SQLITE_OK;
  }
  if( op==SQLITE_FCNTL_SIZE_LIMIT ){
    sqlite3_int64 iLimit = *(sqlite3_int64*)pArg;
    if( iLimit<p->sz ){
      if( iLimit<0 ){
        iLimit = p->szMax;
      }else{
        iLimit = p->sz;
      }
    }
    p->szMax = iLimit;
    *(sqlite3_int64*)pArg = iLimit;
    rc = SQLITE_OK;
  }
  memdbLeave(p);
  return rc;
}